

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makePreview.cpp
# Opt level: O0

void anon_unknown.dwarf_41ee::generatePreview
               (char *inFileName,float exposure,int previewWidth,int *previewHeight,
               Array2D<Imf_3_2::PreviewRgba> *previewPixels)

{
  uchar extraout_AL;
  uchar extraout_AL_00;
  uchar extraout_AL_01;
  int iVar1;
  long sizeX;
  Rgba *pRVar2;
  int *piVar3;
  PreviewRgba *pPVar4;
  Array2D<Imf_3_2::PreviewRgba> *in_RCX;
  int *in_RDX;
  int in_ESI;
  char *in_RDI;
  float in_XMM0_Da;
  float fVar5;
  undefined4 extraout_XMM0_Db;
  double dVar6;
  Rgba *pixel;
  PreviewRgba *preview;
  int x;
  int y;
  float m;
  double fy;
  double fx;
  Array2D<Imf_3_2::Rgba> pixels;
  int h;
  int w;
  float a;
  Box2i dw;
  RgbaInputFile in;
  undefined5 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebd;
  undefined1 in_stack_fffffffffffffebe;
  undefined1 in_stack_fffffffffffffebf;
  Array2D<Imf_3_2::Rgba> *in_stack_fffffffffffffec0;
  double local_128;
  undefined4 in_stack_ffffffffffffff00;
  Array2D<Imf_3_2::Rgba> *this;
  undefined2 in_stack_ffffffffffffff20;
  undefined2 in_stack_ffffffffffffff22;
  undefined2 in_stack_ffffffffffffff24;
  undefined2 in_stack_ffffffffffffff26;
  int local_c4;
  int local_c0;
  int local_a8;
  int local_a4;
  Array2D<Imf_3_2::Rgba> local_a0;
  int local_88;
  int local_84;
  float local_80;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  Array2D<Imf_3_2::Rgba> local_60 [2];
  Array2D<Imf_3_2::PreviewRgba> *local_20;
  int *local_18;
  int local_10;
  float local_c;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_ESI;
  local_c = in_XMM0_Da;
  iVar1 = Imf_3_2::globalThreadCount();
  this = local_60;
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)this,in_RDI,iVar1);
  sizeX = Imf_3_2::RgbaInputFile::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffec0,
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT17(in_stack_fffffffffffffebf,
                      CONCAT16(in_stack_fffffffffffffebe,
                               CONCAT15(in_stack_fffffffffffffebd,in_stack_fffffffffffffeb8))));
  local_80 = (float)Imf_3_2::RgbaInputFile::pixelAspectRatio();
  local_84 = (local_68 - local_70) + 1;
  local_88 = (local_64 - local_6c) + 1;
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
            (this,(long)in_RDI,CONCAT44(local_80,in_stack_ffffffffffffff00));
  Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_a0,0);
  pRVar2 = Imf_3_2::ComputeBasePointer
                     ((Rgba *)in_stack_fffffffffffffec0,
                      (Box2i *)CONCAT17(in_stack_fffffffffffffebf,
                                        CONCAT16(in_stack_fffffffffffffebe,
                                                 CONCAT15(in_stack_fffffffffffffebd,
                                                          in_stack_fffffffffffffeb8))));
  Imf_3_2::RgbaInputFile::setFrameBuffer((Rgba *)local_60,(ulong)pRVar2,1);
  Imf_3_2::RgbaInputFile::readPixels((int)local_60,local_6c);
  local_a4 = (int)(((float)local_88 / ((float)local_84 * local_80)) * (float)local_10 + 0.5);
  local_a8 = 1;
  piVar3 = std::max<int>(&local_a4,&local_a8);
  *local_18 = *piVar3;
  Imf_3_2::Array2D<Imf_3_2::PreviewRgba>::resizeErase
            ((Array2D<Imf_3_2::PreviewRgba> *)
             CONCAT26(in_stack_ffffffffffffff26,
                      CONCAT24(in_stack_ffffffffffffff24,
                               CONCAT22(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20))),sizeX
             ,(long)this);
  if (*local_18 < 2) {
    local_128 = 1.0;
  }
  else {
    local_128 = (double)(local_88 + -1) / (double)(*local_18 + -1);
  }
  fVar5 = Imath_3_2::clamp<float>(local_c + 2.47393,-20.0,20.0);
  dVar6 = std::pow(5.30498947741318e-315,(double)CONCAT44(extraout_XMM0_Db,fVar5));
  for (local_c0 = 0; local_c0 < *local_18; local_c0 = local_c0 + 1) {
    for (local_c4 = 0; local_c4 < local_10; local_c4 = local_c4 + 1) {
      pPVar4 = Imf_3_2::Array2D<Imf_3_2::PreviewRgba>::operator[](local_20,(long)local_c0);
      pPVar4 = pPVar4 + local_c4;
      in_stack_fffffffffffffec0 =
           (Array2D<Imf_3_2::Rgba> *)
           Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[]
                     (&local_a0,(long)(int)((double)local_c0 * local_128 + 0.5));
      gamma((double)((ulong)dVar6 & 0xffffffff));
      pPVar4->r = extraout_AL;
      gamma((double)((ulong)dVar6 & 0xffffffff));
      pPVar4->g = extraout_AL_00;
      gamma((double)((ulong)dVar6 & 0xffffffff));
      pPVar4->b = extraout_AL_01;
      fVar5 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffec0);
      fVar5 = Imath_3_2::clamp<float>(fVar5 * 255.0,0.0,255.0);
      pPVar4->a = (uchar)(int)(fVar5 + 0.5);
    }
  }
  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(in_stack_fffffffffffffec0);
  Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_60);
  return;
}

Assistant:

void
generatePreview (
    const char            inFileName[],
    float                 exposure,
    int                   previewWidth,
    int&                  previewHeight,
    Array2D<PreviewRgba>& previewPixels)
{
    //
    // Read the input file
    //

    RgbaInputFile in (inFileName);

    Box2i dw = in.dataWindow ();
    float a  = in.pixelAspectRatio ();
    int   w  = dw.max.x - dw.min.x + 1;
    int   h  = dw.max.y - dw.min.y + 1;

    Array2D<Rgba> pixels (h, w);
    in.setFrameBuffer (ComputeBasePointer (&pixels[0][0], dw), 1, w);
    in.readPixels (dw.min.y, dw.max.y);

    //
    // Make a preview image
    //

    previewHeight = max (int (h / (w * a) * previewWidth + .5f), 1);
    previewPixels.resizeErase (previewHeight, previewWidth);

    double fx = (previewWidth > 1) ? (double (w - 1) / (previewWidth - 1)) : 1;
    double fy = (previewHeight > 1) ? (double (h - 1) / (previewHeight - 1))
                                    : 1;
    float  m  = std::pow (
        2.f, IMATH_NAMESPACE::clamp (exposure + 2.47393f, -20.f, 20.f));

    for (int y = 0; y < previewHeight; ++y)
    {
        for (int x = 0; x < previewWidth; ++x)
        {
            PreviewRgba& preview = previewPixels[y][x];
            const Rgba&  pixel = pixels[int (y * fy + .5f)][int (x * fx + .5f)];

            preview.r = gamma (pixel.r, m);
            preview.g = gamma (pixel.g, m);
            preview.b = gamma (pixel.b, m);
            preview.a = int (
                IMATH_NAMESPACE::clamp (pixel.a * 255.f, 0.f, 255.f) + .5f);
        }
    }
}